

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O0

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
IndexTools::JointToIndividualIndicesStepSize
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          LIndex jointI,LIndex *step_size,size_t vec_size)

{
  long lVar1;
  undefined8 uStack_a0;
  ulong auStack_98 [2];
  undefined1 *local_88;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_80;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_78;
  long local_70;
  undefined8 auStack_68 [2];
  undefined1 local_52;
  undefined1 local_51;
  ulong local_50;
  LIndex aI;
  size_t sStack_40;
  Index i;
  unsigned_long __vla_expr0;
  LIndex local_30;
  LIndex remainder;
  size_t vec_size_local;
  LIndex *step_size_local;
  LIndex jointI_local;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *result;
  
  local_80 = __return_storage_ptr__;
  local_78 = __return_storage_ptr__;
  jointI_local = (LIndex)__return_storage_ptr__;
  step_size_local = (LIndex *)jointI;
  vec_size_local = (size_t)step_size;
  remainder = vec_size;
  local_30 = jointI;
  __vla_expr0 = (unsigned_long)auStack_98;
  lVar1 = -(vec_size * 8 + 0xf & 0xfffffffffffffff0);
  local_70 = (long)auStack_98 + lVar1;
  sStack_40 = vec_size;
  for (aI._4_4_ = 0; aI._4_4_ < vec_size; aI._4_4_ = aI._4_4_ + 1) {
    local_50 = local_30 / step_size[aI._4_4_];
    *(ulong *)(local_70 + (ulong)aI._4_4_ * 8) = local_50;
    local_30 = local_30 - step_size[aI._4_4_] * local_50;
  }
  local_51 = 0;
  auStack_98[1] = local_70 + vec_size * 8;
  local_88 = &local_52;
  *(undefined8 *)((long)&uStack_a0 + lVar1) = 0xb0cea9;
  std::allocator<unsigned_long_long>::allocator
            (*(allocator<unsigned_long_long> **)((long)&uStack_a0 + lVar1));
  *(undefined8 *)((long)&uStack_a0 + lVar1) = 0xb0cec1;
  std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
  vector<unsigned_long_long*,void>
            (*(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> **)
              ((long)&local_50 + lVar1),*(unsigned_long_long **)(&stack0xffffffffffffffa8 + lVar1),
             *(unsigned_long_long **)((long)auStack_68 + lVar1 + 8),
             *(allocator_type **)((long)auStack_68 + lVar1));
  *(undefined8 *)((long)&uStack_a0 + lVar1) = 0xb0cecc;
  std::allocator<unsigned_long_long>::~allocator
            (*(allocator<unsigned_long_long> **)((long)&uStack_a0 + lVar1));
  local_51 = 1;
  return local_78;
}

Assistant:

vector<LIndex> IndexTools::JointToIndividualIndicesStepSize(LIndex jointI, 
            const LIndex * step_size, size_t vec_size )
{
    LIndex remainder = jointI;

    LIndex resultArr[vec_size];
    for(Index i=0; i < vec_size ; i++)
    {
        LIndex aI = remainder / step_size[i];
        resultArr[i] = aI;//store this indiv. index
        //remainder = remainder %  step_size[i];
        remainder -= step_size[i] * aI;
    }
    vector<LIndex> result(&resultArr[0], &resultArr[vec_size]);
    return(result);
}